

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool __thiscall
ON_SubDimple::IsValidLevel
          (ON_SubDimple *this,ON_SubD *subd,uint level_index,bool bSilentError,ON_TextLog *text_log)

{
  ON_SubDLevel *this_00;
  element_type *peVar1;
  unsigned_short level;
  bool bVar2;
  uint uVar3;
  ON_SubDFacePtr *pOVar4;
  ON_SubDEdgePtr *pOVar5;
  ON_SubDVertex *pOVar6;
  ulong uVar7;
  ON_SubDLevel *pOVar8;
  uint uVar9;
  ON_SubDVertex *vertex;
  uint uVar10;
  ulong uVar11;
  ON_SubDEdge *pOVar12;
  ON__UINT_PTR OVar13;
  long lVar14;
  ulong uVar15;
  ON_SubDFace *pOVar16;
  bool bVar17;
  uint f_id_range [2];
  uint e_id_range [2];
  uint v_id_range [2];
  ON_SubDVertexIterator vit;
  ON_SubDFace *local_a8;
  ON_SubDEdge *local_a0;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  uint local_6c;
  undefined1 local_68 [32];
  ON_SubDVertex *local_48;
  uint local_40;
  
  if ((0xfffe < level_index) || ((uint)(this->m_levels).m_count <= level_index)) {
LAB_005cdf8d:
    ON_SubDIncrementErrorCount();
    if (bSilentError) {
      return false;
    }
    bVar2 = ON_IsNotValid();
    return bVar2;
  }
  this_00 = (this->m_levels).m_a[level_index];
  if ((this_00 == (ON_SubDLevel *)0x0) ||
     (ON_SubDLevel::ClearComponentDamagedState(this_00,true,true,true),
     this_00->m_level_index != level_index)) goto LAB_005cdf8d;
  if (level_index == 0) {
    uVar3 = this_00->m_vertex_count;
    if (((uVar3 < 3) || (this_00->m_edge_count < 3)) || (this_00->m_face_count == 0))
    goto LAB_005cdf8d;
  }
  else {
    pOVar8 = (this->m_levels).m_a[(ulong)level_index - 1];
    if ((((pOVar8 == (ON_SubDLevel *)0x0) ||
         (uVar3 = this_00->m_vertex_count, uVar3 <= pOVar8->m_vertex_count)) ||
        (this_00->m_edge_count <= pOVar8->m_edge_count)) ||
       (this_00->m_face_count <= pOVar8->m_face_count)) goto LAB_005cdf8d;
  }
  pOVar6 = this_00->m_vertex[0];
  if (((pOVar6 == (ON_SubDVertex *)0x0) || (this_00->m_edge[0] == (ON_SubDEdge *)0x0)) ||
     ((this_00->m_face[0] == (ON_SubDFace *)0x0 ||
      (((this_00->m_vertex[1] == (ON_SubDVertex *)0x0 || (this_00->m_edge[1] == (ON_SubDEdge *)0x0))
       || (this_00->m_face[1] == (ON_SubDFace *)0x0)))))) goto LAB_005cdf8d;
  local_80 = 0xffffffffffffffff;
  local_88 = -1;
  local_90 = -1;
  peVar1 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar1 == (element_type *)0x0) ||
     (pOVar8 = peVar1->m_active_level, pOVar8 == (ON_SubDLevel *)0x0)) {
    pOVar8 = &ON_SubDLevel::Empty;
  }
  if (pOVar8->m_level_index == level_index) {
    if (pOVar8->m_vertex[0] != pOVar6) goto LAB_005ce3a6;
    ON_SubDVertexIterator::ON_SubDVertexIterator((ON_SubDVertexIterator *)local_68,subd);
    local_40 = 0;
    local_48 = (ON_SubDVertex *)local_68._16_8_;
    if ((ON_SubDVertex *)local_68._16_8_ == this_00->m_vertex[0]) {
      ON_SubDRef::~ON_SubDRef((ON_SubDRef *)local_68);
      pOVar6 = this_00->m_vertex[0];
      uVar3 = this_00->m_vertex_count;
      goto LAB_005cdfd0;
    }
    ON_SubDIncrementErrorCount();
    if (!bSilentError) {
      bVar2 = ON_IsNotValid();
      goto LAB_005ce14a;
    }
LAB_005cdf85:
    bVar2 = false;
LAB_005ce14a:
    ON_SubDRef::~ON_SubDRef((ON_SubDRef *)local_68);
    return bVar2;
  }
LAB_005cdfd0:
  bVar2 = pOVar6 != (ON_SubDVertex *)0x0;
  if (uVar3 == 0 || !bVar2) {
    bVar17 = true;
    uVar9 = 0;
    vertex = (ON_SubDVertex *)0x0;
  }
  else {
    text_log = (ON_TextLog *)0x0;
    local_78 = CONCAT44(local_78._4_4_,level_index) & 0xffffffff0000ffff;
    local_6c = (uint)bSilentError;
    uVar9 = 0;
    do {
      vertex = pOVar6;
      bVar2 = IsValidSubDVertex(vertex,(unsigned_short)local_78,(uint *)0x0,(unsigned_short)local_6c
                                ,SUB81(text_log,0));
      if (!bVar2) {
        return false;
      }
      uVar3 = (vertex->super_ON_SubDComponentBase).m_id;
      if (uVar9 == 0) {
        local_80 = CONCAT44(uVar3,uVar3);
      }
      else if (uVar3 < (uint)local_80) {
        local_80 = CONCAT44(local_80._4_4_,uVar3);
      }
      else if (local_80._4_4_ < uVar3) {
        local_80 = CONCAT44(uVar3,(uint)local_80);
      }
      uVar10 = (int)text_log + (uint)(vertex->m_edge_count == 0);
      text_log = (ON_TextLog *)(ulong)uVar10;
      uVar9 = uVar9 + 1;
      pOVar6 = vertex->m_next_vertex;
      uVar3 = this_00->m_vertex_count;
      bVar2 = pOVar6 != (ON_SubDVertex *)0x0;
    } while ((uVar9 < uVar3) && (pOVar6 != (ON_SubDVertex *)0x0));
    bVar17 = uVar10 == 0;
  }
  if ((this_00->m_vertex[1] != vertex) || ((bool)(uVar9 != uVar3 | bVar2))) goto LAB_005ce3a6;
  if (((local_80._4_4_ - (uint)local_80) + 1 < uVar9) ||
     (((this->m_heap).m_max_vertex_id < local_80._4_4_ || (!bVar17)))) goto LAB_005ce3a6;
  peVar1 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar1 == (element_type *)0x0) ||
     (pOVar8 = peVar1->m_active_level, pOVar8 == (ON_SubDLevel *)0x0)) {
    pOVar8 = &ON_SubDLevel::Empty;
  }
  if (pOVar8->m_level_index == level_index) {
    if (pOVar8->m_edge[0] != this_00->m_edge[0]) goto LAB_005ce3a6;
    ON_SubDEdgeIterator::ON_SubDEdgeIterator((ON_SubDEdgeIterator *)local_68,subd);
    local_40 = 0;
    local_48 = (ON_SubDVertex *)local_68._16_8_;
    if ((ON_SubDVertex *)local_68._16_8_ != (ON_SubDVertex *)this_00->m_edge[0]) {
      ON_SubDIncrementErrorCount();
      if (!bSilentError) {
        bVar2 = ON_IsNotValid();
        goto LAB_005ce14a;
      }
      goto LAB_005cdf85;
    }
    ON_SubDRef::~ON_SubDRef((ON_SubDRef *)local_68);
  }
  uVar3 = this_00->m_edge_count;
  bVar2 = this_00->m_edge[0] != (ON_SubDEdge *)0x0;
  level = (unsigned_short)level_index;
  if (uVar3 == 0 || !bVar2) {
    uVar9 = 0;
    local_a0 = (ON_SubDEdge *)0x0;
  }
  else {
    uVar9 = 0;
    local_78 = CONCAT44(local_78._4_4_,(uint)bSilentError);
    pOVar12 = this_00->m_edge[0];
    do {
      local_a0 = pOVar12;
      bVar2 = IsValidSubDEdge(local_a0,level,(uint *)0x0,SUB81(local_78,0));
      if (!bVar2) {
        return false;
      }
      uVar3 = (local_a0->super_ON_SubDComponentBase).m_id;
      if (uVar9 == 0) {
        local_88 = (ulong)uVar3 << 0x20;
LAB_005ce1e0:
        local_88 = CONCAT44(local_88._4_4_,uVar3);
      }
      else {
        if (uVar3 < (uint)local_88) goto LAB_005ce1e0;
        if (local_88._4_4_ < uVar3) {
          local_88 = CONCAT44(uVar3,(uint)local_88);
        }
      }
      uVar9 = uVar9 + 1;
      pOVar12 = local_a0->m_next_edge;
      uVar3 = this_00->m_edge_count;
      bVar2 = pOVar12 != (ON_SubDEdge *)0x0;
    } while ((uVar9 < uVar3) && (pOVar12 != (ON_SubDEdge *)0x0));
  }
  if ((bool)(uVar9 != uVar3 | bVar2)) goto LAB_005ce3a6;
  if ((((local_88._4_4_ - (uint)local_88) + 1 < uVar9) || (this_00->m_edge[1] != local_a0)) ||
     ((this->m_heap).m_max_edge_id < local_88._4_4_)) goto LAB_005ce3a6;
  peVar1 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar1 == (element_type *)0x0) ||
     (pOVar8 = peVar1->m_active_level, pOVar8 == (ON_SubDLevel *)0x0)) {
    pOVar8 = &ON_SubDLevel::Empty;
  }
  if (pOVar8->m_level_index == level_index) {
    if (pOVar8->m_face[0] != this_00->m_face[0]) goto LAB_005ce3a6;
    ON_SubDFaceIterator::ON_SubDFaceIterator((ON_SubDFaceIterator *)local_68,subd);
    local_40 = 0;
    local_48 = (ON_SubDVertex *)local_68._16_8_;
    if ((ON_SubDVertex *)local_68._16_8_ != (ON_SubDVertex *)this_00->m_face[0]) {
      ON_SubDIncrementErrorCount();
      if (!bSilentError) {
        bVar2 = ON_IsNotValid();
        goto LAB_005ce14a;
      }
      goto LAB_005cdf85;
    }
    ON_SubDRef::~ON_SubDRef((ON_SubDRef *)local_68);
  }
  uVar3 = this_00->m_face_count;
  bVar2 = this_00->m_face[0] != (ON_SubDFace *)0x0;
  uVar9 = 0;
  pOVar16 = this_00->m_face[0];
  if (uVar3 == 0 || !bVar2) {
    local_a8 = (ON_SubDFace *)0x0;
  }
  else {
    do {
      local_a8 = pOVar16;
      bVar2 = IsValidSubDFace(local_a8,level,(uint *)0x0,(ushort)bSilentError,SUB81(text_log,0));
      if (!bVar2) {
        return false;
      }
      uVar3 = (local_a8->super_ON_SubDComponentBase).m_id;
      if (uVar9 == 0) {
        local_90 = (ulong)uVar3 << 0x20;
LAB_005ce347:
        local_90 = CONCAT44(local_90._4_4_,uVar3);
      }
      else {
        if (uVar3 < (uint)local_90) goto LAB_005ce347;
        if (local_90._4_4_ < uVar3) {
          local_90 = CONCAT44(uVar3,(uint)local_90);
        }
      }
      uVar9 = uVar9 + 1;
      pOVar16 = local_a8->m_next_face;
      uVar3 = this_00->m_face_count;
      bVar2 = pOVar16 != (ON_SubDFace *)0x0;
    } while ((uVar9 < uVar3) && (pOVar16 != (ON_SubDFace *)0x0));
  }
  if (!(bool)(uVar9 != uVar3 | bVar2)) {
    if (((uVar9 <= (local_90._4_4_ - (uint)local_90) + 1) && (this_00->m_face[1] == local_a8)) &&
       (local_90._4_4_ <= (this->m_heap).m_max_face_id)) {
      for (pOVar6 = this_00->m_vertex[0]; pOVar6 != (ON_SubDVertex *)0x0;
          pOVar6 = pOVar6->m_next_vertex) {
        if (pOVar6->m_edge_count != 0) {
          uVar15 = 0;
          do {
            pOVar12 = (ON_SubDEdge *)(pOVar6->m_edges[uVar15].m_ptr & 0xfffffffffffffff8);
            bVar2 = IsValidSubDEdge(pOVar12,level,(uint *)&local_88,bSilentError);
            if (!bVar2) {
              return false;
            }
            if (uVar15 < pOVar6->m_edge_count) {
              OVar13 = (ON__UINT_PTR)((uint)pOVar6->m_edges[uVar15].m_ptr & 1);
            }
            else {
              OVar13 = 0;
            }
            bVar2 = IsValidVertexEdgeLink(pOVar6,pOVar12,OVar13,bSilentError);
            if (!bVar2) {
              return false;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 < pOVar6->m_edge_count);
        }
        if (pOVar6->m_face_count != 0) {
          uVar15 = 0;
          do {
            pOVar16 = pOVar6->m_faces[uVar15];
            bVar2 = IsValidSubDFace(pOVar16,level,(uint *)&local_90,(ushort)bSilentError,
                                    SUB81(text_log,0));
            if (!bVar2) {
              return false;
            }
            text_log = (ON_TextLog *)(ulong)bSilentError;
            bVar2 = IsValidVertexFaceLink(pOVar6,pOVar16,(uint)uVar15,0xffffffff,bSilentError);
            if (!bVar2) {
              return false;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 < pOVar6->m_face_count);
        }
      }
      for (pOVar12 = this_00->m_edge[0]; pOVar12 != (ON_SubDEdge *)0x0;
          pOVar12 = pOVar12->m_next_edge) {
        OVar13 = 0;
        bVar2 = true;
        do {
          bVar17 = bVar2;
          pOVar6 = pOVar12->m_vertex[OVar13];
          bVar2 = IsValidSubDVertex(pOVar6,level,(uint *)&local_80,(ushort)bSilentError,
                                    SUB81(text_log,0));
          if (!bVar2) {
            return false;
          }
          bVar2 = IsValidVertexEdgeLink(pOVar6,pOVar12,OVar13,bSilentError);
          if (!bVar2) {
            return false;
          }
          OVar13 = 1;
          bVar2 = false;
        } while (bVar17);
        if (pOVar12->m_face_count != 0) {
          local_78 = 0xfffffffffffffff0;
          uVar15 = 0;
          do {
            if (uVar15 < 2) {
              pOVar4 = pOVar12->m_face2 + uVar15;
            }
            else {
              pOVar4 = (ON_SubDFacePtr *)((long)&pOVar12->m_facex->m_ptr + local_78);
            }
            pOVar16 = (ON_SubDFace *)(pOVar4->m_ptr & 0xfffffffffffffff8);
            bVar2 = IsValidSubDFace(pOVar16,level,(uint *)&local_90,(ushort)bSilentError,
                                    SUB81(text_log,0));
            if (!bVar2) {
              return false;
            }
            text_log = (ON_TextLog *)(ulong)bSilentError;
            bVar2 = IsValidEdgeFaceLink(pOVar12,pOVar16,(uint)uVar15,0xffffffff,bSilentError);
            if (!bVar2) {
              return false;
            }
            uVar15 = uVar15 + 1;
            local_78 = local_78 + 8;
          } while (uVar15 < pOVar12->m_face_count);
        }
      }
      pOVar16 = this_00->m_face[0];
      if (pOVar16 != (ON_SubDFace *)0x0) {
        do {
          if (pOVar16->m_edge_count != 0) {
            lVar14 = -0x20;
            uVar15 = 0;
            do {
              if (uVar15 < 4) {
                pOVar5 = pOVar16->m_edge4 + uVar15;
              }
              else {
                pOVar5 = (ON_SubDEdgePtr *)((long)&pOVar16->m_edgex->m_ptr + lVar14);
              }
              pOVar12 = (ON_SubDEdge *)(pOVar5->m_ptr & 0xfffffffffffffff8);
              bVar2 = IsValidSubDEdge(pOVar12,level,(uint *)&local_88,bSilentError);
              if (!bVar2) {
                return false;
              }
              uVar11 = (ulong)(uint)bSilentError;
              bVar2 = IsValidEdgeFaceLink(pOVar12,pOVar16,0xffffffff,(uint)uVar15,bSilentError);
              if (!bVar2) {
                return false;
              }
              uVar15 = uVar15 + 1;
              lVar14 = lVar14 + 8;
            } while (uVar15 < pOVar16->m_edge_count);
            if (pOVar16->m_edge_count != 0) {
              lVar14 = -0x20;
              uVar15 = 0;
              do {
                if (uVar15 < 4) {
                  pOVar5 = pOVar16->m_edge4 + uVar15;
                }
                else {
                  pOVar5 = (ON_SubDEdgePtr *)((long)&pOVar16->m_edgex->m_ptr + lVar14);
                }
                uVar7 = pOVar5->m_ptr & 0xfffffffffffffff8;
                if (uVar7 == 0) {
                  pOVar6 = (ON_SubDVertex *)0x0;
                }
                else {
                  pOVar6 = *(ON_SubDVertex **)(uVar7 + 0x80 + (ulong)((uint)pOVar5->m_ptr & 1) * 8);
                }
                bVar2 = IsValidSubDVertex(pOVar6,level,(uint *)&local_80,(ushort)bSilentError,
                                          SUB81(uVar11,0));
                if (!bVar2) {
                  return false;
                }
                uVar11 = (ulong)(uint)bSilentError;
                bVar2 = IsValidVertexFaceLink(pOVar6,pOVar16,0xffffffff,(uint)uVar15,bSilentError);
                if (!bVar2) {
                  return false;
                }
                uVar15 = uVar15 + 1;
                lVar14 = lVar14 + 8;
              } while (uVar15 < pOVar16->m_edge_count);
            }
          }
          pOVar16 = pOVar16->m_next_face;
        } while (pOVar16 != (ON_SubDFace *)0x0);
      }
      for (pOVar12 = this_00->m_edge[0]; pOVar12 != (ON_SubDEdge *)0x0;
          pOVar12 = pOVar12->m_next_edge) {
        bVar2 = IsValidSubDEdgeTag(pOVar12,bSilentError);
        if (!bVar2) {
          return false;
        }
      }
      for (pOVar6 = this_00->m_vertex[0]; pOVar6 != (ON_SubDVertex *)0x0;
          pOVar6 = pOVar6->m_next_vertex) {
        bVar2 = IsValidSubDVertexTag(pOVar6,bSilentError);
        if (!bVar2) {
          return false;
        }
      }
      pOVar12 = this_00->m_edge[0];
      if (pOVar12 == (ON_SubDEdge *)0x0) {
        return true;
      }
      while( true ) {
        ON_3dPoint::ON_3dPoint((ON_3dPoint *)local_68,pOVar12->m_vertex[0]->m_P);
        ON_3dPoint::ON_3dPoint((ON_3dPoint *)(local_68 + 0x18),pOVar12->m_vertex[1]->m_P);
        bVar2 = ON_3dPoint::operator!=((ON_3dPoint *)local_68,(ON_3dPoint *)(local_68 + 0x18));
        if (!bVar2) break;
        pOVar12 = pOVar12->m_next_edge;
        if (pOVar12 == (ON_SubDEdge *)0x0) {
          return true;
        }
      }
      ON_ComponentStatus::SetDamagedState(&(pOVar12->super_ON_SubDComponentBase).m_status,true);
    }
  }
LAB_005ce3a6:
  ON_SubDIncrementErrorCount();
  if (bSilentError) {
    return false;
  }
  bVar2 = ON_IsNotValid();
  return bVar2;
}

Assistant:

bool ON_SubDimple::IsValidLevel(
  const ON_SubD& subd,
  unsigned int level_index,
  bool bSilentError,
  ON_TextLog* text_log
  ) const
{
  const unsigned int level_count = m_levels.UnsignedCount();
  if (level_index >= level_count || level_index >= 0xFFFF)
    return ON_SubDIsNotValid(bSilentError);
  const ON_SubDLevel* level = m_levels[level_index];
  if ( nullptr == level)
    return ON_SubDIsNotValid(bSilentError);
  level->ClearComponentDamagedState();

  if ( level->m_level_index != level_index)
    return ON_SubDIsNotValid(bSilentError);

  if (level_index <= 0)
  {
    if (level->m_vertex_count < 3)
      return ON_SubDIsNotValid(bSilentError);
    if (level->m_edge_count < 3)
      return ON_SubDIsNotValid(bSilentError);
    if (level->m_face_count < 1)
      return ON_SubDIsNotValid(bSilentError);
  }
  else
  {
    const ON_SubDLevel* previous_level = m_levels[level_index - 1];
    if (nullptr == previous_level)
      return ON_SubDIsNotValid(bSilentError);
    if (level->m_vertex_count <= previous_level->m_vertex_count)
      return ON_SubDIsNotValid(bSilentError);
    if (level->m_edge_count <= previous_level->m_edge_count)
      return ON_SubDIsNotValid(bSilentError);
    if (level->m_face_count <= previous_level->m_face_count)
      return ON_SubDIsNotValid(bSilentError);
  }

  if (nullptr == level->m_vertex[0])
    return ON_SubDIsNotValid(bSilentError);
  if (nullptr == level->m_edge[0])
    return ON_SubDIsNotValid(bSilentError);
  if (nullptr == level->m_face[0])
    return ON_SubDIsNotValid(bSilentError);

  if (nullptr == level->m_vertex[1])
    return ON_SubDIsNotValid(bSilentError);
  if (nullptr == level->m_edge[1])
    return ON_SubDIsNotValid(bSilentError);
  if (nullptr == level->m_face[1])
    return ON_SubDIsNotValid(bSilentError);


  const unsigned short expected_level = (unsigned short)level_index;
  unsigned int i;
  const ON_SubDVertex* vertex;
  const ON_SubDEdge* edge;
  const ON_SubDFace* face;

  unsigned int v_id_range[2] = { ON_UNSET_UINT_INDEX, ON_UNSET_UINT_INDEX };
  unsigned int e_id_range[2] = { ON_UNSET_UINT_INDEX, ON_UNSET_UINT_INDEX };
  unsigned int f_id_range[2] = { ON_UNSET_UINT_INDEX, ON_UNSET_UINT_INDEX };

  unsigned int point_vertex_count = 0;
  unsigned int wire_edge_count = 0;

  // simple vertex validation
  if (level_index == subd.ActiveLevelIndex())
  {
    if (subd.FirstVertex() != level->m_vertex[0])
      return ON_SubDIsNotValid(bSilentError);
    ON_SubDVertexIterator vit = subd.VertexIterator();
    if (vit.FirstVertex() != level->m_vertex[0])
      return ON_SubDIsNotValid(bSilentError);
    // IsValid() should not create these clunky cached arrays.
    //ON_SubDVertexArray va = subd.VertexArray();
    //if (va.VertexCount() != level->m_vertex_count)
    //  return ON_SubDIsNotValid(bSilentError);
    //if (va[0] != level->m_vertex[0])
    //  return ON_SubDIsNotValid(bSilentError);
    //if (va[level->m_vertex_count-1] != level->m_vertex[1])
    //  return ON_SubDIsNotValid(bSilentError);
  }
  const ON_SubDVertex* last_vertex = nullptr;
  for (i = 0, vertex = level->m_vertex[0]; i < level->m_vertex_count && nullptr != vertex; i++, vertex = vertex->m_next_vertex)
  {
    if (false == IsValidSubDVertex(vertex, expected_level, nullptr, level->m_ordinary_vertex_valence, bSilentError))
      return false;

    if (0 == i)
    {
      v_id_range[0] = v_id_range[1] = vertex->m_id;
    }
    else if (vertex->m_id < v_id_range[0])
      v_id_range[0] = vertex->m_id;
    else if (vertex->m_id > v_id_range[1])
      v_id_range[1] = vertex->m_id;

    if (0 == vertex->m_edge_count)
    {
      point_vertex_count++;
    }
    last_vertex = vertex;
  }
  if (level->m_vertex[1] != last_vertex)
    return ON_SubDIsNotValid(bSilentError);


  if (i != level->m_vertex_count || nullptr != vertex)
    return ON_SubDIsNotValid(bSilentError);
  if (1 + v_id_range[1] - v_id_range[0] < level->m_vertex_count)
    return ON_SubDIsNotValid(bSilentError);
  if ( v_id_range[1] > MaximumVertexId() )
    return ON_SubDIsNotValid(bSilentError);

  // currently, point vertices are not permitted
  if (point_vertex_count > 0)
    return ON_SubDIsNotValid(bSilentError);

  // simple edge validation
  if (level_index == subd.ActiveLevelIndex())
  {
    if (subd.FirstEdge() != level->m_edge[0])
      return ON_SubDIsNotValid(bSilentError);
    ON_SubDEdgeIterator eit = subd.EdgeIterator();
    if (eit.FirstEdge() != level->m_edge[0])
      return ON_SubDIsNotValid(bSilentError);

    // IsValid() should not create these clunky cached arrays.
    //ON_SubDEdgeArray ea = subd.EdgeArray();
    //if (ea.EdgeCount() != level->m_edge_count)
    //  return ON_SubDIsNotValid(bSilentError);
    //if (ea[0] != level->m_edge[0])
    //  return ON_SubDIsNotValid(bSilentError);
    //if (ea[level->m_edge_count-1] != level->m_edge[1])
    //  return ON_SubDIsNotValid(bSilentError);
  }
  const ON_SubDEdge* last_edge = nullptr;
  for (i = 0, edge = level->m_edge[0]; i < level->m_edge_count && nullptr != edge; i++, edge = edge->m_next_edge)
  {
    if (false == IsValidSubDEdge(edge, expected_level, nullptr, bSilentError))
      return false;
    if (0 == edge->m_face_count)
    {
      wire_edge_count++;
    }
    if (0 == i)
    {
      e_id_range[0] = e_id_range[1] = edge->m_id;
    }
    else if (edge->m_id < e_id_range[0])
      e_id_range[0] = edge->m_id;
    else if (edge->m_id > e_id_range[1])
      e_id_range[1] = edge->m_id;

    last_edge = edge;
  }
  if (i != level->m_edge_count || nullptr != edge)
    return ON_SubDIsNotValid(bSilentError);
  if (1 + e_id_range[1] - e_id_range[0] < level->m_edge_count)
    return ON_SubDIsNotValid(bSilentError);
  if (level->m_edge[1] != last_edge)
    return ON_SubDIsNotValid(bSilentError);
  if ( e_id_range[1] > MaximumEdgeId() )
    return ON_SubDIsNotValid(bSilentError);
   
  // As of November 12, 2019
  // Wire edges are permitted. THey exist in subds being edited.
  ////// currently, wire edges are not permitted
  ////if (wire_edge_count > 0)
  ////  return ON_SubDIsNotValid(bSilentError);
   
  // simple face validation
  if (level_index == subd.ActiveLevelIndex())
  {
    if (subd.FirstFace() != level->m_face[0])
      return ON_SubDIsNotValid(bSilentError);
    ON_SubDFaceIterator fit = subd.FaceIterator();
    if (fit.FirstFace() != level->m_face[0])
      return ON_SubDIsNotValid(bSilentError);
    // IsValid() should not create these clunky cached arrays.
    //ON_SubDFaceArray fa = subd.FaceArray();
    //if (fa.FaceCount() != level->m_face_count)
    //  return ON_SubDIsNotValid(bSilentError);
    //if (fa[0] != level->m_face[0])
    //  return ON_SubDIsNotValid(bSilentError);
    //if (fa[0] != level->m_face[0])
    //  return ON_SubDIsNotValid(bSilentError);
  }
  const ON_SubDFace* last_face = nullptr;
  for (i = 0, face = level->m_face[0]; i < level->m_face_count && nullptr != face; i++, face = face->m_next_face)
  {
    if (false == IsValidSubDFace(face, expected_level, nullptr, level->m_ordinary_face_edge_count, bSilentError))
      return false;

    if (0 == i)
    {
      f_id_range[0] = f_id_range[1] = face->m_id;
    }
    else if (face->m_id < f_id_range[0])
      f_id_range[0] = face->m_id;
    else if (face->m_id > f_id_range[1])
      f_id_range[1] = face->m_id;

    last_face = face;
  }
  if (i != level->m_face_count || nullptr != face)
    return ON_SubDIsNotValid(bSilentError);
  if (1 + f_id_range[1] - f_id_range[0] < level->m_face_count)
    return ON_SubDIsNotValid(bSilentError);  
  if (level->m_face[1] != last_face)
    return ON_SubDIsNotValid(bSilentError);
  if ( f_id_range[1] > MaximumFaceId() )
    return ON_SubDIsNotValid(bSilentError);


  // vertex topology validation
  for (vertex = level->m_vertex[0]; nullptr != vertex; vertex = vertex->m_next_vertex)
  {
    for (i = 0; i < vertex->m_edge_count; i++)
    {
      edge = vertex->Edge(i);
      if (false == IsValidSubDEdge(edge, expected_level, e_id_range, bSilentError))
        return false;
      if (false == IsValidVertexEdgeLink(vertex, edge, vertex->EdgeDirection(i), bSilentError))
        return false;
    }

    for (i = 0; i < vertex->m_face_count; i++)
    {
      face = vertex->Face(i);
      if (false == IsValidSubDFace(face, expected_level, f_id_range, level->m_ordinary_face_edge_count, bSilentError))
        return false;
      if (false == IsValidVertexFaceLink(vertex, face, i, ON_UNSET_UINT_INDEX, bSilentError))
        return false;
    }
  }

  // edge topology validation
  for (edge = level->m_edge[0]; nullptr != edge; edge = edge->m_next_edge)
  {
    for (i = 0; i < 2; i++)
    {
      vertex = edge->m_vertex[i];
      if (false == IsValidSubDVertex(vertex, expected_level, v_id_range, level->m_ordinary_vertex_valence, bSilentError))
        return false;
      if (false == IsValidVertexEdgeLink(vertex, edge, i, bSilentError))
        return false;
    }

    for (i = 0; i < edge->m_face_count; i++)
    {
      face = edge->Face(i);
      if (false == IsValidSubDFace(face, expected_level, f_id_range, level->m_ordinary_face_edge_count, bSilentError))
        return false;
      if (false == IsValidEdgeFaceLink(edge, face, i, ON_UNSET_UINT_INDEX, bSilentError))
        return false;
    }
  }

  // face topology validation
  for (face = level->m_face[0]; nullptr != face; face = face->m_next_face)
  {
    for (i = 0; i < face->m_edge_count; i++)
    {
      edge = face->Edge(i);
      if (false == IsValidSubDEdge(edge, expected_level, e_id_range, bSilentError))
        return false;
      if (false == IsValidEdgeFaceLink(edge, face, ON_UNSET_UINT_INDEX, i, bSilentError))
        return false;
    }

    for (i = 0; i < face->m_edge_count; i++)
    {
      vertex = face->Vertex(i);
      if (false == IsValidSubDVertex(vertex, expected_level, v_id_range, level->m_ordinary_vertex_valence, bSilentError))
        return false;
      if (false == IsValidVertexFaceLink(vertex, face, ON_UNSET_UINT_INDEX, i, bSilentError))
        return false;
    }
  }


  // edge tag validation
  for (edge = level->m_edge[0]; nullptr != edge; edge = edge->m_next_edge)
  {
    if (false == IsValidSubDEdgeTag(edge, bSilentError))
      return false;
  }

  // vertex tag validation
  for (vertex = level->m_vertex[0]; nullptr != vertex; vertex = vertex->m_next_vertex)
  {
    if (false == IsValidSubDVertexTag(vertex, bSilentError))
      return false;
  }

  // edge length validation
  for (edge = level->m_edge[0]; nullptr != edge; edge = edge->m_next_edge)
  {
    const ON_3dPoint P[2] = { edge->m_vertex[0]->ControlNetPoint(), edge->m_vertex[1]->ControlNetPoint() };
    if (false == (P[0] != P[1]))
    {
      edge->m_status.SetDamagedState(true);
      return ON_SubDIsNotValid(bSilentError);
    }
  }


  return true;
}